

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O0

ACES * __thiscall
AS_02::ACES::ACES_PDesc_to_MD
          (ACES *this,PictureDescriptor *PDesc,Dictionary *dict,
          RGBAEssenceDescriptor *EssenceDescriptor)

{
  uint n;
  bool bVar1;
  uint *puVar2;
  byte_t *pbVar3;
  size_type sVar4;
  const_reference pvVar5;
  double in;
  RGBALayout local_118 [24];
  UL local_100;
  RGBALayout local_e0 [24];
  UL local_c8;
  UL local_a8;
  UL local_78;
  uchar local_51;
  Rational local_50;
  Rational local_48;
  Rational aspect_ratio;
  uint local_38;
  uint local_34;
  ulong local_30;
  RGBAEssenceDescriptor *local_28;
  RGBAEssenceDescriptor *EssenceDescriptor_local;
  Dictionary *dict_local;
  PictureDescriptor *PDesc_local;
  
  local_30 = (ulong)PDesc->ContainerDuration;
  local_28 = EssenceDescriptor;
  EssenceDescriptor_local = (RGBAEssenceDescriptor *)dict;
  dict_local = (Dictionary *)PDesc;
  PDesc_local = (PictureDescriptor *)this;
  ASDCP::MXF::optional_property<unsigned_long_long>::operator=
            ((optional_property<unsigned_long_long> *)(EssenceDescriptor + 0xf8),&local_30);
  ASDCP::MXF::Rational::operator=((Rational *)(local_28 + 0xe8),(Rational *)dict_local);
  local_28[0x152] = (RGBAEssenceDescriptor)0x0;
  *(int *)(local_28 + 0x154) = (*(int *)(dict_local + 0x44) - *(int *)(dict_local + 0x3c)) + 1;
  *(int *)(local_28 + 0x158) = (*(int *)(dict_local + 0x48) - *(int *)(dict_local + 0x40)) + 1;
  local_34 = (*(int *)(dict_local + 0x54) - *(int *)(dict_local + 0x4c)) + 1;
  ASDCP::MXF::optional_property<unsigned_int>::operator=
            ((optional_property<unsigned_int> *)(local_28 + 0x18c),&local_34);
  local_38 = (*(int *)(dict_local + 0x58) - *(int *)(dict_local + 0x50)) + 1;
  ASDCP::MXF::optional_property<unsigned_int>::operator=
            ((optional_property<unsigned_int> *)(local_28 + 0x184),&local_38);
  aspect_ratio.Denominator = *(int *)(dict_local + 0x4c) - *(int *)(dict_local + 0x3c);
  ASDCP::MXF::optional_property<unsigned_int>::operator=
            ((optional_property<unsigned_int> *)(local_28 + 0x194),(uint *)&aspect_ratio.Denominator
            );
  aspect_ratio.Numerator = *(int *)(dict_local + 0x50) - *(int *)(dict_local + 0x40);
  ASDCP::MXF::optional_property<unsigned_int>::operator=
            ((optional_property<unsigned_int> *)(local_28 + 0x19c),(uint *)&aspect_ratio);
  puVar2 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_int_
                     ((optional_property *)(local_28 + 0x18c));
  n = *puVar2;
  puVar2 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_int_
                     ((optional_property *)(local_28 + 0x184));
  ASDCP::Rational::Rational(&local_48,n,*puVar2);
  if (local_48.Denominator != 0) {
    in = ASDCP::Rational::Quotient(&local_48);
    local_50 = ConvertToRational(in);
    ASDCP::MXF::Rational::operator=((Rational *)(local_28 + 0x1b0),&local_50);
  }
  local_51 = '\0';
  ASDCP::MXF::optional_property<unsigned_char>::operator=
            ((optional_property<unsigned_char> *)(local_28 + 0x1c2),&local_51);
  pbVar3 = ASDCP::Dictionary::ul((Dictionary *)EssenceDescriptor_local,MDD_ColorPrimaries_ACES);
  ASDCP::UL::UL(&local_78,pbVar3);
  ASDCP::MXF::optional_property<ASDCP::UL>::operator=
            ((optional_property<ASDCP::UL> *)(local_28 + 600),&local_78);
  ASDCP::UL::~UL(&local_78);
  pbVar3 = ASDCP::Dictionary::ul
                     ((Dictionary *)EssenceDescriptor_local,MDD_TransferCharacteristic_linear);
  ASDCP::UL::UL(&local_a8,pbVar3);
  ASDCP::MXF::optional_property<ASDCP::UL>::operator=
            ((optional_property<ASDCP::UL> *)(local_28 + 0x1c8),&local_a8);
  ASDCP::UL::~UL(&local_a8);
  sVar4 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::size
                    ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                     (dict_local + 0x70));
  if (sVar4 == 3) {
    pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                       ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                        (dict_local + 0x70),0);
    bVar1 = std::operator==(&pvVar5->name,"B");
    if (!bVar1) goto LAB_001af585;
    pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                       ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                        (dict_local + 0x70),1);
    bVar1 = std::operator==(&pvVar5->name,"G");
    if (!bVar1) goto LAB_001af585;
    pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                       ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                        (dict_local + 0x70),2);
    bVar1 = std::operator==(&pvVar5->name,"R");
    if (!bVar1) goto LAB_001af585;
    pbVar3 = ASDCP::Dictionary::ul
                       ((Dictionary *)EssenceDescriptor_local,
                        MDD_ACESUncompressedMonoscopicWithoutAlpha);
    ASDCP::UL::UL(&local_c8,pbVar3);
    ASDCP::UL::operator=((UL *)(local_28 + 0x210),&local_c8);
    ASDCP::UL::~UL(&local_c8);
    ASDCP::MXF::RGBALayout::RGBALayout(local_e0,ACESPixelLayoutMonoscopicWOAlpha);
    ASDCP::MXF::RGBALayout::operator=((RGBALayout *)(local_28 + 0x390),local_e0);
    ASDCP::MXF::RGBALayout::~RGBALayout(local_e0);
LAB_001af9b4:
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  else {
LAB_001af585:
    sVar4 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::size
                      ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                       (dict_local + 0x70));
    if (sVar4 == 4) {
      pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                         ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                          (dict_local + 0x70),0);
      bVar1 = std::operator==(&pvVar5->name,"A");
      if (bVar1) {
        pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                           ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                            (dict_local + 0x70),1);
        bVar1 = std::operator==(&pvVar5->name,"B");
        if (bVar1) {
          pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                             ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *
                              )(dict_local + 0x70),2);
          bVar1 = std::operator==(&pvVar5->name,"G");
          if (bVar1) {
            pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                               ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                 *)(dict_local + 0x70),3);
            bVar1 = std::operator==(&pvVar5->name,"R");
            if (bVar1) {
              pbVar3 = ASDCP::Dictionary::ul
                                 ((Dictionary *)EssenceDescriptor_local,
                                  MDD_ACESUncompressedMonoscopicWithAlpha);
              ASDCP::UL::UL(&local_100,pbVar3);
              ASDCP::UL::operator=((UL *)(local_28 + 0x210),&local_100);
              ASDCP::UL::~UL(&local_100);
              ASDCP::MXF::RGBALayout::RGBALayout(local_118,ACESPixelLayoutMonoscopicWAlpha);
              ASDCP::MXF::RGBALayout::operator=((RGBALayout *)(local_28 + 0x390),local_118);
              ASDCP::MXF::RGBALayout::~RGBALayout(local_118);
              goto LAB_001af9b4;
            }
          }
        }
      }
    }
    sVar4 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::size
                      ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                       (dict_local + 0x70));
    if (sVar4 == 6) {
      pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                         ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                          (dict_local + 0x70),0);
      bVar1 = std::operator==(&pvVar5->name,"B");
      if (bVar1) {
        pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                           ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                            (dict_local + 0x70),1);
        bVar1 = std::operator==(&pvVar5->name,"G");
        if (bVar1) {
          pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                             ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *
                              )(dict_local + 0x70),2);
          bVar1 = std::operator==(&pvVar5->name,"R");
          if (bVar1) {
            pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                               ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                 *)(dict_local + 0x70),3);
            bVar1 = std::operator==(&pvVar5->name,"left.B");
            if (bVar1) {
              pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                                 ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                   *)(dict_local + 0x70),4);
              bVar1 = std::operator==(&pvVar5->name,"left.G");
              if (bVar1) {
                pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::
                         at((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                            (dict_local + 0x70),5);
                bVar1 = std::operator==(&pvVar5->name,"left.R");
                if (bVar1) {
                  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_NOTIMPL);
                  return this;
                }
              }
            }
          }
        }
      }
    }
    sVar4 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::size
                      ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                       (dict_local + 0x70));
    if (sVar4 == 8) {
      pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                         ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                          (dict_local + 0x70),0);
      bVar1 = std::operator==(&pvVar5->name,"A");
      if (bVar1) {
        pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                           ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                            (dict_local + 0x70),1);
        bVar1 = std::operator==(&pvVar5->name,"B");
        if (bVar1) {
          pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                             ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *
                              )(dict_local + 0x70),2);
          bVar1 = std::operator==(&pvVar5->name,"G");
          if (bVar1) {
            pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                               ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                 *)(dict_local + 0x70),3);
            bVar1 = std::operator==(&pvVar5->name,"R");
            if (bVar1) {
              pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                                 ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                   *)(dict_local + 0x70),4);
              bVar1 = std::operator==(&pvVar5->name,"left.A");
              if (bVar1) {
                pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::
                         at((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_> *)
                            (dict_local + 0x70),5);
                bVar1 = std::operator==(&pvVar5->name,"left.B");
                if (bVar1) {
                  pvVar5 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                           ::at((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                 *)(dict_local + 0x70),6);
                  bVar1 = std::operator==(&pvVar5->name,"left.G");
                  if (bVar1) {
                    pvVar5 = std::
                             vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::at
                                       ((vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                         *)(dict_local + 0x70),7);
                    bVar1 = std::operator==(&pvVar5->name,"left.R");
                    if (bVar1) {
                      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_NOTIMPL);
                      return this;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_NOTIMPL);
  }
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::ACES_PDesc_to_MD(const PictureDescriptor &PDesc, const ASDCP::Dictionary &dict, ASDCP::MXF::RGBAEssenceDescriptor &EssenceDescriptor)
{

  EssenceDescriptor.ContainerDuration = PDesc.ContainerDuration;
  EssenceDescriptor.SampleRate = PDesc.EditRate;
  EssenceDescriptor.FrameLayout = 0x00;
  EssenceDescriptor.StoredWidth = PDesc.DataWindow.xMax - PDesc.DataWindow.xMin + 1;
  EssenceDescriptor.StoredHeight = PDesc.DataWindow.yMax - PDesc.DataWindow.yMin + 1;
  EssenceDescriptor.DisplayWidth = PDesc.DisplayWindow.xMax - PDesc.DisplayWindow.xMin + 1;
  EssenceDescriptor.DisplayHeight = PDesc.DisplayWindow.yMax - PDesc.DisplayWindow.yMin + 1;
  EssenceDescriptor.DisplayXOffset = PDesc.DisplayWindow.xMin - PDesc.DataWindow.xMin;
  EssenceDescriptor.DisplayYOffset = PDesc.DisplayWindow.yMin - PDesc.DataWindow.yMin;
  ASDCP::Rational aspect_ratio(EssenceDescriptor.DisplayWidth, EssenceDescriptor.DisplayHeight);
  if(aspect_ratio.Denominator != 0)  EssenceDescriptor.AspectRatio = AS_02::ConvertToRational(aspect_ratio.Quotient());
  EssenceDescriptor.AlphaTransparency = 0x00;
  EssenceDescriptor.ColorPrimaries = dict.ul(MDD_ColorPrimaries_ACES);
  EssenceDescriptor.TransferCharacteristic = dict.ul(MDD_TransferCharacteristic_linear);
  if(PDesc.Channels.size() == 3 && PDesc.Channels.at(0).name == "B" && PDesc.Channels.at(1).name == "G" && PDesc.Channels.at(2).name == "R")
  {
    EssenceDescriptor.PictureEssenceCoding = dict.ul(MDD_ACESUncompressedMonoscopicWithoutAlpha); //Picture Essence Coding Label per 2065-5 section 8.2
    EssenceDescriptor.PixelLayout = RGBALayout(ACESPixelLayoutMonoscopicWOAlpha);
  }
  else if(PDesc.Channels.size() == 4 && PDesc.Channels.at(0).name == "A" && PDesc.Channels.at(1).name == "B" && PDesc.Channels.at(2).name == "G" && PDesc.Channels.at(3).name == "R")
  {
    EssenceDescriptor.PictureEssenceCoding = dict.ul(MDD_ACESUncompressedMonoscopicWithAlpha); //Picture Essence Coding Label per 2065-5
    EssenceDescriptor.PixelLayout = RGBALayout(ACESPixelLayoutMonoscopicWAlpha);
  }
  else if(PDesc.Channels.size() == 6 && PDesc.Channels.at(0).name == "B" && PDesc.Channels.at(1).name == "G" && PDesc.Channels.at(2).name == "R" &&
                            PDesc.Channels.at(3).name == "left.B" && PDesc.Channels.at(4).name == "left.G" && PDesc.Channels.at(5).name == "left.R")
  {
    return RESULT_NOTIMPL;
  }
  else if(PDesc.Channels.size() == 8 && PDesc.Channels.at(0).name == "A" && PDesc.Channels.at(1).name == "B" && PDesc.Channels.at(2).name == "G" && PDesc.Channels.at(3).name == "R" &&
                            PDesc.Channels.at(4).name == "left.A" && PDesc.Channels.at(5).name == "left.B" && PDesc.Channels.at(6).name == "left.G" && PDesc.Channels.at(7).name == "left.R")
  {
    return RESULT_NOTIMPL;
  }
  else
  {
    return RESULT_NOTIMPL;
  }
  return RESULT_OK;
}